

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O3

string_t __thiscall
duckdb::MD5Operator::Operation<duckdb::string_t,duckdb::string_t>
          (MD5Operator *this,string_t input,Vector *result)

{
  ulong uVar1;
  char *out_digest;
  const_data_ptr_t input_00;
  anon_union_16_2_67f50693_for_value aVar2;
  string_t sVar3;
  string_t hash;
  MD5Context context;
  undefined1 local_a8 [16];
  undefined8 local_98;
  const_data_ptr_t local_90;
  MD5Context local_88;
  
  aVar2.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(input.value._8_8_,(Vector *)0x20,(idx_t)input.value._8_8_);
  local_a8 = (undefined1  [16])aVar2.pointer;
  MD5Context::MD5Context(&local_88);
  input_00 = input.value._0_8_;
  if ((uint)this < 0xd) {
    input_00 = (const_data_ptr_t)((long)&local_98 + 4);
  }
  local_98 = this;
  local_90 = input.value._0_8_;
  MD5Context::MD5Update(&local_88,input_00,(ulong)this & 0xffffffff);
  out_digest = aVar2._8_8_;
  if (aVar2._0_4_ < 0xd) {
    out_digest = local_a8 + 4;
  }
  MD5Context::FinishHex(&local_88,out_digest);
  uVar1 = (ulong)(uint)local_a8._0_4_;
  if (uVar1 < 0xd) {
    switchD_012e3010::default(local_a8 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_a8._4_4_ = *(undefined4 *)local_a8._8_8_;
  }
  sVar3.value.pointer.ptr = (char *)local_a8._8_8_;
  sVar3.value._0_8_ = local_a8._0_8_;
  return (string_t)sVar3.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto hash = StringVector::EmptyString(result, MD5Context::MD5_HASH_LENGTH_TEXT);
		MD5Context context;
		context.Add(input);
		context.FinishHex(hash.GetDataWriteable());
		hash.Finalize();
		return hash;
	}